

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::BinaryOperator::isResolved(BinaryOperator *this)

{
  Expression *pEVar1;
  int iVar2;
  char local_28 [16];
  RefCountedPtr<soul::Structure> local_18;
  
  pEVar1 = (this->lhs).object;
  if ((((pEVar1->kind == value) &&
       (iVar2 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
       (char)iVar2 != '\0')) && (pEVar1 = (this->rhs).object, pEVar1->kind == value)) &&
     (iVar2 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar2 != '\0'
     )) {
    (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_28,this);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_18);
    return local_28[0] != '\0';
  }
  return false;
}

Assistant:

bool isResolved() const override            { return isResolvedAsValue (lhs.get()) && isResolvedAsValue (rhs.get()) && getResultType().isValid(); }